

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O0

int testJSONHelpers(int param_1,char **param_2)

{
  bool bVar1;
  char **param_1_local;
  int param_0_local;
  
  bVar1 = anon_unknown.dwarf_72e95::testInt();
  if (bVar1) {
    bVar1 = anon_unknown.dwarf_72e95::testUInt();
    if (bVar1) {
      bVar1 = anon_unknown.dwarf_72e95::testBool();
      if (bVar1) {
        bVar1 = anon_unknown.dwarf_72e95::testString();
        if (bVar1) {
          bVar1 = anon_unknown.dwarf_72e95::testObject();
          if (bVar1) {
            bVar1 = anon_unknown.dwarf_72e95::testObjectInherited();
            if (bVar1) {
              bVar1 = anon_unknown.dwarf_72e95::testObjectNoExtra();
              if (bVar1) {
                bVar1 = anon_unknown.dwarf_72e95::testObjectOptional();
                if (bVar1) {
                  bVar1 = anon_unknown.dwarf_72e95::testVector();
                  if (bVar1) {
                    bVar1 = anon_unknown.dwarf_72e95::testVectorFilter();
                    if (bVar1) {
                      bVar1 = anon_unknown.dwarf_72e95::testMap();
                      if (bVar1) {
                        bVar1 = anon_unknown.dwarf_72e95::testMapFilter();
                        if (bVar1) {
                          bVar1 = anon_unknown.dwarf_72e95::testOptional();
                          if (bVar1) {
                            bVar1 = anon_unknown.dwarf_72e95::testRequired();
                            if (bVar1) {
                              param_1_local._4_4_ = 0;
                            }
                            else {
                              param_1_local._4_4_ = 1;
                            }
                          }
                          else {
                            param_1_local._4_4_ = 1;
                          }
                        }
                        else {
                          param_1_local._4_4_ = 1;
                        }
                      }
                      else {
                        param_1_local._4_4_ = 1;
                      }
                    }
                    else {
                      param_1_local._4_4_ = 1;
                    }
                  }
                  else {
                    param_1_local._4_4_ = 1;
                  }
                }
                else {
                  param_1_local._4_4_ = 1;
                }
              }
              else {
                param_1_local._4_4_ = 1;
              }
            }
            else {
              param_1_local._4_4_ = 1;
            }
          }
          else {
            param_1_local._4_4_ = 1;
          }
        }
        else {
          param_1_local._4_4_ = 1;
        }
      }
      else {
        param_1_local._4_4_ = 1;
      }
    }
    else {
      param_1_local._4_4_ = 1;
    }
  }
  else {
    param_1_local._4_4_ = 1;
  }
  return param_1_local._4_4_;
}

Assistant:

int testJSONHelpers(int /*unused*/, char* /*unused*/ [])
{
  if (!testInt()) {
    return 1;
  }
  if (!testUInt()) {
    return 1;
  }
  if (!testBool()) {
    return 1;
  }
  if (!testString()) {
    return 1;
  }
  if (!testObject()) {
    return 1;
  }
  if (!testObjectInherited()) {
    return 1;
  }
  if (!testObjectNoExtra()) {
    return 1;
  }
  if (!testObjectOptional()) {
    return 1;
  }
  if (!testVector()) {
    return 1;
  }
  if (!testVectorFilter()) {
    return 1;
  }
  if (!testMap()) {
    return 1;
  }
  if (!testMapFilter()) {
    return 1;
  }
  if (!testOptional()) {
    return 1;
  }
  if (!testRequired()) {
    return 1;
  }
  return 0;
}